

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O1

void __thiscall
duckdb::BatchedDataCollection::Append
          (BatchedDataCollection *this,DataChunk *input,idx_t batch_index)

{
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var1;
  pointer pLVar2;
  ColumnDataCollection *pCVar3;
  BufferManager *buffer_manager;
  Allocator *allocator_p;
  pointer this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var4;
  unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
  new_collection;
  optional_ptr<duckdb::ColumnDataCollection,_true> collection;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_58;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  local_50._M_head_impl = (ColumnDataCollection *)0x0;
  _Var4._M_head_impl = (this->last_collection).collection;
  if ((_Var4._M_head_impl == (ColumnDataCollection *)0x0) ||
     ((this->last_collection).batch_index != batch_index)) {
    local_58._M_head_impl = (ColumnDataCollection *)0x0;
    if (_Var4._M_head_impl == (ColumnDataCollection *)0x0) {
      if (this->buffer_managed == true) {
        buffer_manager = BufferManager::GetBufferManager(this->context);
        pCVar3 = (ColumnDataCollection *)operator_new(0x70);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_48,
                   &(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        ColumnDataCollection::ColumnDataCollection
                  (pCVar3,buffer_manager,(vector<duckdb::LogicalType,_true> *)&local_48);
      }
      else {
        allocator_p = Allocator::DefaultAllocator();
        pCVar3 = (ColumnDataCollection *)operator_new(0x70);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_48,
                   &(this->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
        ColumnDataCollection::ColumnDataCollection
                  (pCVar3,allocator_p,(vector<duckdb::LogicalType,_true> *)&local_48);
      }
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
      _Var4._M_head_impl = local_58._M_head_impl;
      local_58._M_head_impl = pCVar3;
    }
    else {
      pCVar3 = (ColumnDataCollection *)operator_new(0x70);
      ColumnDataCollection::ColumnDataCollection(pCVar3,_Var4._M_head_impl);
      _Var4._M_head_impl = local_58._M_head_impl;
      local_58._M_head_impl = pCVar3;
    }
    if (_Var4._M_head_impl != (ColumnDataCollection *)0x0) {
      ColumnDataCollection::~ColumnDataCollection(_Var4._M_head_impl);
      operator_delete(_Var4._M_head_impl);
    }
    (this->last_collection).collection = local_58._M_head_impl;
    (this->last_collection).batch_index = batch_index;
    this_00 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
              ::operator->((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                            *)&local_58);
    ColumnDataCollection::InitializeAppend(this_00,&(this->last_collection).append_state);
    local_50._M_head_impl = local_58._M_head_impl;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_58._M_head_impl;
    local_58._M_head_impl = (ColumnDataCollection *)0x0;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)batch_index;
    ::std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>>
    ::
    _M_emplace_unique<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
              ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>,std::_Select1st<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>>
                *)&this->data,
               (pair<unsigned_long,_duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>
                *)&local_48);
    pLVar2 = local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ColumnDataCollection *)
        local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
        _M_impl.super__Vector_impl_data._M_finish != (ColumnDataCollection *)0x0) {
      ColumnDataCollection::~ColumnDataCollection
                ((ColumnDataCollection *)
                 local_48.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      operator_delete(pLVar2);
    }
    _Var1._M_head_impl = local_58._M_head_impl;
    _Var4._M_head_impl = local_50._M_head_impl;
    if (local_58._M_head_impl != (ColumnDataCollection *)0x0) {
      ColumnDataCollection::~ColumnDataCollection(local_58._M_head_impl);
      operator_delete(_Var1._M_head_impl);
      _Var4._M_head_impl = local_50._M_head_impl;
    }
  }
  local_50._M_head_impl = _Var4._M_head_impl;
  optional_ptr<duckdb::ColumnDataCollection,_true>::CheckValid
            ((optional_ptr<duckdb::ColumnDataCollection,_true> *)&local_50);
  ColumnDataCollection::Append(local_50._M_head_impl,&(this->last_collection).append_state,input);
  return;
}

Assistant:

void BatchedDataCollection::Append(DataChunk &input, idx_t batch_index) {
	D_ASSERT(batch_index != DConstants::INVALID_INDEX);
	optional_ptr<ColumnDataCollection> collection;
	if (last_collection.collection && last_collection.batch_index == batch_index) {
		// we are inserting into the same collection as before: use it directly
		collection = last_collection.collection;
	} else {
		// new collection: check if there is already an entry
		D_ASSERT(data.find(batch_index) == data.end());
		unique_ptr<ColumnDataCollection> new_collection;
		if (last_collection.collection) {
			new_collection = make_uniq<ColumnDataCollection>(*last_collection.collection);
		} else if (buffer_managed) {
			new_collection = make_uniq<ColumnDataCollection>(BufferManager::GetBufferManager(context), types);
		} else {
			new_collection = make_uniq<ColumnDataCollection>(Allocator::DefaultAllocator(), types);
		}
		last_collection.collection = new_collection.get();
		last_collection.batch_index = batch_index;
		new_collection->InitializeAppend(last_collection.append_state);
		collection = new_collection.get();
		data.insert(make_pair(batch_index, std::move(new_collection)));
	}
	collection->Append(last_collection.append_state, input);
}